

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

QString * __thiscall
QString::section(QString *__return_storage_ptr__,QString *this,QString *sep,qsizetype start,
                qsizetype end,SectionFlags flags)

{
  QStringView *pQVar1;
  qsizetype qVar2;
  undefined1 *puVar3;
  long lVar4;
  undefined1 *puVar5;
  char16_t *pcVar6;
  long lVar7;
  long lVar8;
  undefined1 *puVar9;
  undefined1 *puVar10;
  long in_FS_OFFSET;
  QStringView sep_00;
  QString *ret;
  undefined1 *local_98;
  undefined1 *local_90;
  QStringView local_68;
  QList<QStringView> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (QStringView *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.m_data = (this->d).ptr;
  local_68.m_size = (this->d).size;
  sep_00.m_data = (sep->d).ptr;
  sep_00.m_size = (sep->d).size;
  QStringView::split(&local_58,&local_68,sep_00,(SplitBehavior)0x0,
                     (uint)(((uint)flags.super_QFlagsStorageHelper<QString::SectionFlag,_4>.
                                   super_QFlagsStorage<QString::SectionFlag>.i & 8) == 0));
  qVar2 = local_58.d.size;
  puVar3 = (undefined1 *)local_58.d.size;
  if (((uint)flags.super_QFlagsStorageHelper<QString::SectionFlag,_4>.
             super_QFlagsStorage<QString::SectionFlag>.i & 1) != 0) {
    if ((undefined1 *)local_58.d.size == (undefined1 *)0x0) {
      lVar7 = 0;
    }
    else {
      lVar8 = 0;
      lVar7 = 0;
      do {
        lVar7 = lVar7 + (ulong)(*(long *)((long)&(local_58.d.ptr)->m_size + lVar8) == 0);
        lVar8 = lVar8 + 0x10;
      } while (local_58.d.size << 4 != lVar8);
    }
    puVar3 = (undefined1 *)(local_58.d.size + -lVar7);
  }
  puVar5 = (undefined1 *)((start >> 0x3f & (ulong)puVar3) + start);
  if ((((long)puVar5 < local_58.d.size) &&
      (puVar3 = (undefined1 *)((end >> 0x3f & (ulong)puVar3) + end), -1 < (long)puVar3)) &&
     ((long)puVar5 <= (long)puVar3)) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    local_98 = puVar3;
    local_90 = puVar5;
    if ((undefined1 *)local_58.d.size != (undefined1 *)0x0) {
      lVar7 = 0;
      puVar9 = (undefined1 *)0x0;
      puVar10 = (undefined1 *)0x0;
      do {
        pQVar1 = local_58.d.ptr;
        lVar8 = *(long *)((long)&(local_58.d.ptr)->m_size + lVar7);
        if ((long)puVar5 <= (long)puVar10) {
          if (puVar10 == puVar3) {
            local_98 = puVar9;
          }
          if (puVar10 == puVar5) {
            local_90 = puVar9;
          }
          lVar4 = lVar8;
          if (puVar9 != (undefined1 *)0x0 && (long)puVar5 < (long)puVar10) {
            append(__return_storage_ptr__,sep);
            lVar4 = *(long *)((long)&pQVar1->m_size + lVar7);
          }
          if ((0 < lVar4) &&
             (pcVar6 = *(char16_t **)((long)&pQVar1->m_data + lVar7), pcVar6 != (char16_t *)0x0)) {
            QtPrivate::QCommonArrayOps<char16_t>::growAppend
                      ((QCommonArrayOps<char16_t> *)__return_storage_ptr__,pcVar6,pcVar6 + lVar4);
            (__return_storage_ptr__->d).ptr[(__return_storage_ptr__->d).size] = L'\0';
          }
        }
        puVar10 = puVar10 + (((uint)flags.super_QFlagsStorageHelper<QString::SectionFlag,_4>.
                                    super_QFlagsStorage<QString::SectionFlag>.i & 1) == 0 ||
                            lVar8 != 0);
        if ((long)puVar3 < (long)puVar10) break;
        puVar9 = puVar9 + 1;
        lVar7 = lVar7 + 0x10;
      } while (puVar9 < (ulong)qVar2);
    }
    if ((((uint)flags.super_QFlagsStorageHelper<QString::SectionFlag,_4>.
                super_QFlagsStorage<QString::SectionFlag>.i & 2) != 0) && (0 < (long)local_90)) {
      pcVar6 = (sep->d).ptr;
      if ((QChar *)pcVar6 == (QChar *)0x0) {
        pcVar6 = &_empty;
      }
      insert(__return_storage_ptr__,0,(QChar *)pcVar6,(sep->d).size);
    }
    if ((((uint)flags.super_QFlagsStorageHelper<QString::SectionFlag,_4>.
                super_QFlagsStorage<QString::SectionFlag>.i & 4) != 0) &&
       ((long)local_98 < (long)(qVar2 + -1))) {
      append(__return_storage_ptr__,sep);
    }
  }
  else {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,0x10,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString QString::section(const QString &sep, qsizetype start, qsizetype end, SectionFlags flags) const
{
    const QList<QStringView> sections = QStringView{ *this }.split(
            sep, Qt::KeepEmptyParts, (flags & SectionCaseInsensitiveSeps) ? Qt::CaseInsensitive : Qt::CaseSensitive);
    const qsizetype sectionsSize = sections.size();
    if (!(flags & SectionSkipEmpty)) {
        if (start < 0)
            start += sectionsSize;
        if (end < 0)
            end += sectionsSize;
    } else {
        qsizetype skip = 0;
        for (qsizetype k = 0; k < sectionsSize; ++k) {
            if (sections.at(k).isEmpty())
                skip++;
        }
        if (start < 0)
            start += sectionsSize - skip;
        if (end < 0)
            end += sectionsSize - skip;
    }
    if (start >= sectionsSize || end < 0 || start > end)
        return QString();

    QString ret;
    qsizetype first_i = start, last_i = end;
    for (qsizetype x = 0, i = 0; x <= end && i < sectionsSize; ++i) {
        const QStringView &section = sections.at(i);
        const bool empty = section.isEmpty();
        if (x >= start) {
            if (x == start)
                first_i = i;
            if (x == end)
                last_i = i;
            if (x > start && i > 0)
                ret += sep;
            ret += section;
        }
        if (!empty || !(flags & SectionSkipEmpty))
            x++;
    }
    if ((flags & SectionIncludeLeadingSep) && first_i > 0)
        ret.prepend(sep);
    if ((flags & SectionIncludeTrailingSep) && last_i < sectionsSize - 1)
        ret += sep;
    return ret;
}